

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_parse.c
# Opt level: O3

AvsdFrame_t * get_one_save(AvsdCtx_t *p_dec,HalDecTask *task)

{
  avsd_memory_t *paVar1;
  long lVar2;
  
  paVar1 = p_dec->mem;
  lVar2 = 0;
  do {
    if (*(int *)((long)&paVar1->save[0].valid + lVar2) == 0) {
      *(undefined4 *)((long)&paVar1->save[0].valid + lVar2) = 1;
      return (AvsdFrame_t *)((long)&paVar1->save[0].valid + lVar2);
    }
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0xc0);
  _mpp_log_l(2,"avsd_parse","mem_save dpb %d slots has not get\n",(char *)0x0,3);
  return (AvsdFrame_t *)0x0;
}

Assistant:

static AvsdFrame_t *get_one_save(AvsdCtx_t *p_dec, HalDecTask *task)
{
    RK_U32 i = 0;
    AvsdFrame_t *p_cur = NULL;

    for (i = 0; i < MPP_ARRAY_ELEMS(p_dec->mem->save); i++) {
        if (!p_dec->mem->save[i].valid) {
            p_dec->mem->save[i].valid = 1;
            p_cur = &p_dec->mem->save[i];
            break;
        }
    }
    if (!p_cur) {
        mpp_err("mem_save dpb %d slots has not get\n", MPP_ARRAY_ELEMS(p_dec->mem->save));
        goto __FAILED;
    }
    (void)task;
    return p_cur;
__FAILED:
    reset_one_save(p_cur);

    return NULL;
}